

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O2

char * Tobjnam(obj *otmp,char *verb)

{
  char *pcVar1;
  size_t sVar2;
  char *__src;
  
  pcVar1 = xname(otmp);
  pcVar1 = The(pcVar1);
  if (verb != (char *)0x0) {
    sVar2 = strlen(pcVar1);
    (pcVar1 + sVar2)[0] = ' ';
    (pcVar1 + sVar2)[1] = '\0';
    __src = otense(otmp,verb);
    pcVar1 = strcat(pcVar1,__src);
    return pcVar1;
  }
  return pcVar1;
}

Assistant:

char *Tobjnam(const struct obj *otmp, const char *verb)
{
	char *bp = The(xname(otmp));

	if (verb) {
	    strcat(bp, " ");
	    strcat(bp, otense(otmp, verb));
	}
	return bp;
}